

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_sCAL(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  size_t heighti;
  ulong uStack_30;
  int state;
  size_t i;
  png_bytep buffer;
  png_inforp ppStack_18;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  buffer._4_4_ = length;
  ppStack_18 = info_ptr;
  info_ptr_local = (png_inforp)png_ptr;
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) == 0) {
      if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x4000) == 0)) {
        if (length < 4) {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error((png_const_structrp)info_ptr_local,"invalid");
        }
        else {
          i = (size_t)png_read_buffer(png_ptr,(ulong)(length + 1),2);
          if ((png_bytep)i == (png_bytep)0x0) {
            png_chunk_benign_error((png_const_structrp)info_ptr_local,"out of memory");
            png_crc_finish((png_structrp)info_ptr_local,buffer._4_4_);
          }
          else {
            png_crc_read((png_structrp)info_ptr_local,(png_bytep)i,buffer._4_4_);
            *(undefined1 *)(i + buffer._4_4_) = 0;
            iVar2 = png_crc_finish((png_structrp)info_ptr_local,0);
            if (iVar2 == 0) {
              if ((*(char *)i == '\x01') || (*(char *)i == '\x02')) {
                uStack_30 = 1;
                heighti._4_4_ = 0;
                iVar2 = png_check_fp_number((png_const_charp)i,(ulong)buffer._4_4_,
                                            (int *)((long)&heighti + 4),&stack0xffffffffffffffd0);
                if ((iVar2 == 0) ||
                   ((buffer._4_4_ <= uStack_30 ||
                    (uVar3 = uStack_30 + 1, pcVar1 = (char *)(i + uStack_30), uStack_30 = uVar3,
                    *pcVar1 != '\0')))) {
                  png_chunk_benign_error((png_const_structrp)info_ptr_local,"bad width format");
                }
                else if ((heighti._4_4_ & 0x188) == 0x108) {
                  heighti._4_4_ = 0;
                  iVar2 = png_check_fp_number((png_const_charp)i,(ulong)buffer._4_4_,
                                              (int *)((long)&heighti + 4),&stack0xffffffffffffffd0);
                  if ((iVar2 == 0) || (uStack_30 != buffer._4_4_)) {
                    png_chunk_benign_error((png_const_structrp)info_ptr_local,"bad height format");
                  }
                  else if ((heighti._4_4_ & 0x188) == 0x108) {
                    png_set_sCAL_s((png_const_structrp)info_ptr_local,ppStack_18,(uint)*(byte *)i,
                                   (png_const_charp)(i + 1),(png_const_charp)(i + uVar3));
                  }
                  else {
                    png_chunk_benign_error((png_const_structrp)info_ptr_local,"non-positive height")
                    ;
                  }
                }
                else {
                  png_chunk_benign_error((png_const_structrp)info_ptr_local,"non-positive width");
                }
              }
              else {
                png_chunk_benign_error((png_const_structrp)info_ptr_local,"invalid unit");
              }
            }
          }
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error((png_const_structrp)info_ptr_local,"duplicate");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error((png_const_structrp)info_ptr_local,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_sCAL(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_bytep buffer;
   size_t i;
   int state;

   png_debug(1, "in png_handle_sCAL");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_sCAL) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   /* Need unit type, width, \0, height: minimum 4 bytes */
   else if (length < 4)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_debug1(2, "Allocating and reading sCAL chunk data (%u bytes)",
       length + 1);

   buffer = png_read_buffer(png_ptr, length+1, 2/*silent*/);

   if (buffer == NULL)
   {
      png_chunk_benign_error(png_ptr, "out of memory");
      png_crc_finish(png_ptr, length);
      return;
   }

   png_crc_read(png_ptr, buffer, length);
   buffer[length] = 0; /* Null terminate the last string */

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* Validate the unit. */
   if (buffer[0] != 1 && buffer[0] != 2)
   {
      png_chunk_benign_error(png_ptr, "invalid unit");
      return;
   }

   /* Validate the ASCII numbers, need two ASCII numbers separated by
    * a '\0' and they need to fit exactly in the chunk data.
    */
   i = 1;
   state = 0;

   if (png_check_fp_number((png_const_charp)buffer, length, &state, &i) == 0 ||
       i >= length || buffer[i++] != 0)
      png_chunk_benign_error(png_ptr, "bad width format");

   else if (PNG_FP_IS_POSITIVE(state) == 0)
      png_chunk_benign_error(png_ptr, "non-positive width");

   else
   {
      size_t heighti = i;

      state = 0;
      if (png_check_fp_number((png_const_charp)buffer, length,
          &state, &i) == 0 || i != length)
         png_chunk_benign_error(png_ptr, "bad height format");

      else if (PNG_FP_IS_POSITIVE(state) == 0)
         png_chunk_benign_error(png_ptr, "non-positive height");

      else
         /* This is the (only) success case. */
         png_set_sCAL_s(png_ptr, info_ptr, buffer[0],
             (png_charp)buffer+1, (png_charp)buffer+heighti);
   }
}